

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_face_load_strike_metrics(TT_Face face,FT_ULong strike_index,FT_Size_Metrics *metrics)

{
  FT_Byte FVar1;
  FT_Stream stream_00;
  FT_Byte *pFVar2;
  FT_UInt16 FVar3;
  uint uVar4;
  FT_Int32 FVar5;
  FT_Long FVar6;
  long lVar7;
  FT_Int32 b;
  FT_Byte *p;
  FT_Error error;
  FT_Fixed scale;
  TT_HoriHeader *hori;
  FT_UShort resolution;
  FT_UShort ppem;
  FT_UInt offset;
  FT_Stream stream;
  FT_Char min_after_bl;
  FT_Char max_before_bl;
  FT_Byte *strike;
  FT_Size_Metrics *metrics_local;
  FT_ULong strike_index_local;
  TT_Face face_local;
  
  if (face->sbit_strike_map == (FT_UInt *)0x0) {
    metrics_local = (FT_Size_Metrics *)strike_index;
    if (face->sbit_num_strikes <= strike_index) {
      return 6;
    }
  }
  else {
    if ((ulong)(long)(face->root).num_fixed_sizes <= strike_index) {
      return 6;
    }
    metrics_local = (FT_Size_Metrics *)(ulong)face->sbit_strike_map[strike_index];
  }
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    pFVar2 = face->sbit_table;
    lVar7 = (long)metrics_local * 0x30;
    metrics->x_ppem = (ushort)pFVar2[lVar7 + 0x34];
    metrics->y_ppem = (ushort)pFVar2[lVar7 + 0x35];
    metrics->ascender = (long)((int)(char)pFVar2[lVar7 + 0x18] << 6);
    metrics->descender = (long)((int)(char)pFVar2[lVar7 + 0x19] << 6);
    FVar1 = pFVar2[lVar7 + 0x21];
    if (metrics->descender < 1) {
      if ((metrics->descender == 0) && (metrics->ascender == 0)) {
        if ((pFVar2[lVar7 + 0x20] == '\0') && (FVar1 == '\0')) {
          metrics->ascender = (long)(int)((uint)metrics->y_ppem << 6);
          metrics->descender = 0;
        }
        else {
          metrics->ascender = (long)((int)(char)pFVar2[lVar7 + 0x20] << 6);
          metrics->descender = (long)((int)(char)FVar1 << 6);
        }
      }
    }
    else if ((char)FVar1 < '\0') {
      metrics->descender = -metrics->descender;
    }
    metrics->height = metrics->ascender - metrics->descender;
    if (metrics->height == 0) {
      metrics->height = (long)(int)((uint)metrics->y_ppem << 6);
      metrics->descender = metrics->ascender - metrics->height;
    }
    metrics->max_advance =
         (long)(int)(((int)(char)pFVar2[lVar7 + 0x1e] + (uint)pFVar2[lVar7 + 0x1a] +
                     (int)(char)pFVar2[lVar7 + 0x1f]) * 0x40);
    FVar6 = FT_DivFix((long)(int)((uint)metrics->x_ppem << 6),(ulong)(face->header).Units_Per_EM);
    metrics->x_scale = FVar6;
    FVar6 = FT_DivFix((long)(int)((uint)metrics->y_ppem << 6),(ulong)(face->header).Units_Per_EM);
    metrics->y_scale = FVar6;
    face_local._4_4_ = 0;
  }
  else if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
    stream_00 = (face->root).stream;
    pFVar2 = face->sbit_table;
    uVar4 = (uint)pFVar2[(long)metrics_local * 4 + 8] << 0x18 |
            (uint)pFVar2[(long)metrics_local * 4 + 9] << 0x10 |
            (uint)pFVar2[(long)metrics_local * 4 + 10] << 8 |
            (uint)pFVar2[(long)metrics_local * 4 + 0xb];
    if (face->ebdt_size < (ulong)(uVar4 + 4)) {
      face_local._4_4_ = 3;
    }
    else {
      p._4_4_ = FT_Stream_Seek(stream_00,face->ebdt_start + (ulong)uVar4);
      if ((p._4_4_ == 0) && (p._4_4_ = FT_Stream_EnterFrame(stream_00,4), p._4_4_ == 0)) {
        FVar3 = FT_Stream_GetUShort(stream_00);
        FT_Stream_GetUShort(stream_00);
        FT_Stream_ExitFrame(stream_00);
        metrics->x_ppem = FVar3;
        metrics->y_ppem = FVar3;
        FVar6 = FT_DivFix((long)(int)((uint)FVar3 << 6),(ulong)(face->header).Units_Per_EM);
        b = (FT_Int32)FVar6;
        FVar5 = FT_MulFix_x86_64((int)(face->horizontal).Ascender,b);
        metrics->ascender = (long)FVar5;
        FVar5 = FT_MulFix_x86_64((int)(face->horizontal).Descender,b);
        metrics->descender = (long)FVar5;
        FVar5 = FT_MulFix_x86_64(((int)(face->horizontal).Ascender -
                                 (int)(face->horizontal).Descender) +
                                 (int)(face->horizontal).Line_Gap,b);
        metrics->height = (long)FVar5;
        FVar5 = FT_MulFix_x86_64((uint)(face->horizontal).advance_Width_Max,b);
        metrics->max_advance = (long)FVar5;
        metrics->x_scale = FVar6;
        metrics->y_scale = FVar6;
        face_local._4_4_ = p._4_4_;
      }
      else {
        face_local._4_4_ = p._4_4_;
      }
    }
  }
  else {
    face_local._4_4_ = 2;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_strike_metrics( TT_Face           face,
                               FT_ULong          strike_index,
                               FT_Size_Metrics*  metrics )
  {
    /* we have to test for the existence of `sbit_strike_map'    */
    /* because the function gets also used at the very beginning */
    /* to construct `sbit_strike_map' itself                     */
    if ( face->sbit_strike_map )
    {
      if ( strike_index >= (FT_ULong)face->root.num_fixed_sizes )
        return FT_THROW( Invalid_Argument );

      /* map to real index */
      strike_index = face->sbit_strike_map[strike_index];
    }
    else
    {
      if ( strike_index >= (FT_ULong)face->sbit_num_strikes )
        return FT_THROW( Invalid_Argument );
    }

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  strike;
        FT_Char   max_before_bl;
        FT_Char   min_after_bl;


        strike = face->sbit_table + 8 + strike_index * 48;

        metrics->x_ppem = (FT_UShort)strike[44];
        metrics->y_ppem = (FT_UShort)strike[45];

        metrics->ascender  = (FT_Char)strike[16] * 64;  /* hori.ascender  */
        metrics->descender = (FT_Char)strike[17] * 64;  /* hori.descender */

        /* Due to fuzzy wording in the EBLC documentation, we find both */
        /* positive and negative values for `descender'.  Additionally, */
        /* many fonts have both `ascender' and `descender' set to zero  */
        /* (which is definitely wrong).  MS Windows simply ignores all  */
        /* those values...  For these reasons we apply some heuristics  */
        /* to get a reasonable, non-zero value for the height.          */

        max_before_bl = (FT_Char)strike[24];
        min_after_bl  = (FT_Char)strike[25];

        if ( metrics->descender > 0 )
        {
          /* compare sign of descender with `min_after_bl' */
          if ( min_after_bl < 0 )
            metrics->descender = -metrics->descender;
        }

        else if ( metrics->descender == 0 )
        {
          if ( metrics->ascender == 0 )
          {
            FT_TRACE2(( "tt_face_load_strike_metrics:"
                        " sanitizing invalid ascender and descender\n" ));
            FT_TRACE2(( "                            "
                        " values for strike %ld (%dppem, %dppem)\n",
                        strike_index,
                        metrics->x_ppem, metrics->y_ppem ));

            /* sanitize buggy ascender and descender values */
            if ( max_before_bl || min_after_bl )
            {
              metrics->ascender  = max_before_bl * 64;
              metrics->descender = min_after_bl * 64;
            }
            else
            {
              metrics->ascender  = metrics->y_ppem * 64;
              metrics->descender = 0;
            }
          }
        }

#if 0
        else
          ; /* if we have a negative descender, simply use it */
#endif

        metrics->height = metrics->ascender - metrics->descender;
        if ( metrics->height == 0 )
        {
          FT_TRACE2(( "tt_face_load_strike_metrics:"
                      " sanitizing invalid height value\n" ));
          FT_TRACE2(( "                            "
                      " for strike (%d, %d)\n",
                      metrics->x_ppem, metrics->y_ppem ));
          metrics->height    = metrics->y_ppem * 64;
          metrics->descender = metrics->ascender - metrics->height;
        }

        /* Is this correct? */
        metrics->max_advance = ( (FT_Char)strike[22] + /* min_origin_SB  */
                                          strike[18] + /* max_width      */
                                 (FT_Char)strike[23]   /* min_advance_SB */
                                                     ) * 64;

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_DivFix( metrics->x_ppem * 64,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_DivFix( metrics->y_ppem * 64,
                                      face->header.Units_Per_EM );

        return FT_Err_Ok;
      }

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_Stream       stream = face->root.stream;
        FT_UInt         offset;
        FT_UShort       ppem, resolution;
        TT_HoriHeader  *hori;
        FT_Fixed        scale;

        FT_Error  error;
        FT_Byte*  p;


        p      = face->sbit_table + 8 + 4 * strike_index;
        offset = FT_NEXT_ULONG( p );

        if ( offset + 4 > face->ebdt_size )
          return FT_THROW( Invalid_File_Format );

        if ( FT_STREAM_SEEK( face->ebdt_start + offset ) ||
             FT_FRAME_ENTER( 4 )                         )
          return error;

        ppem       = FT_GET_USHORT();
        resolution = FT_GET_USHORT();

        FT_UNUSED( resolution ); /* What to do with this? */

        FT_FRAME_EXIT();

        metrics->x_ppem = ppem;
        metrics->y_ppem = ppem;

        scale = FT_DivFix( ppem * 64, face->header.Units_Per_EM );
        hori  = &face->horizontal;

        metrics->ascender    = FT_MulFix( hori->Ascender, scale );
        metrics->descender   = FT_MulFix( hori->Descender, scale );
        metrics->height      =
          FT_MulFix( hori->Ascender - hori->Descender + hori->Line_Gap,
                     scale );
        metrics->max_advance = FT_MulFix( hori->advance_Width_Max, scale );

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = scale;
        metrics->y_scale = scale;

        return error;
      }

    default:
      return FT_THROW( Unknown_File_Format );
    }
  }